

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

string * __thiscall
dmlc::StackTrace_abi_cxx11_
          (string *__return_storage_ptr__,dmlc *this,size_t start_frame,size_t stack_size)

{
  int iVar1;
  void **ppvVar2;
  void *__ptr;
  ostream *poVar3;
  char *msg_str;
  char *extraout_RDX;
  undefined1 auVar4 [16];
  undefined1 local_1f8 [8];
  string msg;
  int frameno;
  char **msgs;
  int nframes;
  allocator<void_*> local_1b1;
  undefined1 local_1b0 [8];
  vector<void_*,_std::allocator<void_*>_> stack;
  ostringstream stacktrace_os;
  size_t stack_size_local;
  size_t start_frame_local;
  string *stack_trace;
  
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &stack.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<void_*>::allocator(&local_1b1);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_1b0,start_frame,&local_1b1);
  std::allocator<void_*>::~allocator(&local_1b1);
  ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::data
                      ((vector<void_*,_std::allocator<void_*>_> *)local_1b0);
  iVar1 = backtrace(ppvVar2,start_frame & 0xffffffff);
  std::operator<<((ostream *)
                  &stack.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,"Stack trace:\n");
  ppvVar2 = std::vector<void_*,_std::allocator<void_*>_>::data
                      ((vector<void_*,_std::allocator<void_*>_> *)local_1b0);
  auVar4 = backtrace_symbols(ppvVar2,iVar1);
  msg_str = auVar4._8_8_;
  __ptr = auVar4._0_8_;
  if (__ptr != (void *)0x0) {
    for (msg.field_2._12_4_ = SUB84(this,0); (int)msg.field_2._12_4_ < iVar1;
        msg.field_2._12_4_ = msg.field_2._12_4_ + 1) {
      Demangle_abi_cxx11_((string *)local_1f8,
                          *(dmlc **)((long)__ptr + (long)(int)msg.field_2._12_4_ * 8),msg_str);
      poVar3 = std::operator<<((ostream *)
                               &stack.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,"  [bt] (");
      poVar3 = (ostream *)
               std::ostream::operator<<(poVar3,(long)(int)msg.field_2._12_4_ - (long)this);
      poVar3 = std::operator<<(poVar3,") ");
      poVar3 = std::operator<<(poVar3,(string *)local_1f8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)local_1f8);
      msg_str = extraout_RDX;
    }
  }
  free(__ptr);
  std::__cxx11::ostringstream::str();
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &stack.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

inline std::string StackTrace(
    size_t start_frame = 1,
    const size_t stack_size = DMLC_LOG_STACK_TRACE_SIZE) {
  using std::string;
  std::ostringstream stacktrace_os;
  std::vector<void*> stack(stack_size);
  int nframes = backtrace(stack.data(), static_cast<int>(stack_size));
  stacktrace_os << "Stack trace:\n";
  char **msgs = backtrace_symbols(stack.data(), nframes);
  if (msgs != nullptr) {
    for (int frameno = start_frame; frameno < nframes; ++frameno) {
      string msg = dmlc::Demangle(msgs[frameno]);
      stacktrace_os << "  [bt] (" << frameno - start_frame << ") " << msg << "\n";
    }
  }
  free(msgs);
  string stack_trace = stacktrace_os.str();
  return stack_trace;
}